

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_right_value_reference.cpp
# Opt level: O0

void use_right_value_reference(void)

{
  ostream *poVar1;
  void *pvVar2;
  double local_40;
  double *local_38;
  double *v3;
  double **local_28;
  double *v2;
  double **local_18;
  double *v1;
  double v;
  
  v1 = (double *)0x400c000000000000;
  v2 = (double *)0x401c70a3d70a3d71;
  local_18 = &v2;
  v3 = (double *)0xc037400000000000;
  local_28 = &v3;
  local_40 = f(-23.25);
  local_38 = &local_40;
  poVar1 = std::operator<<((ostream *)&std::cout,"v value and address: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)v1);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,&v1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"v1 value and address: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)*local_18);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_18);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"v2 value and address: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)*local_28);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_28);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"v3 value and address: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_38);
  poVar1 = std::operator<<(poVar1,", ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_38);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void use_right_value_reference() {
    using namespace std;

    double v = 3.5;

    //  right value reference: a reference holding a right value
    //  what's the difference?
    double && v1 = 7.11;
    double && v2 = v * 2.5 - 32;
    double && v3 = f(v2);

    //  seems no difference...
    cout << "v value and address: " << v << ", " << & v << endl;
    cout << "v1 value and address: " << v1 << ", " << & v1 << endl;
    cout << "v2 value and address: " << v2 << ", " << & v2 << endl;
    cout << "v3 value and address: " << v3 << ", " << & v3 << endl;
}